

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3de2e::logical_combination<((anonymous_namespace)::logical_combination_types)2>::
validate(logical_combination<((anonymous_namespace)::logical_combination_types)2> *this,
        json_pointer *ptr,json *instance,json_patch *patch,error_handler *e)

{
  logical_combination_error_handler *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  value_t vVar3;
  array_t *paVar4;
  element_type *peVar5;
  _Alloc_hider _Var6;
  char cVar7;
  pointer psVar8;
  vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar9;
  long *plVar10;
  undefined8 *puVar11;
  ulong uVar12;
  size_type *psVar13;
  undefined8 *puVar14;
  ulong uVar15;
  pointer *ppeVar16;
  size_t __new_size;
  char cVar17;
  undefined8 uVar18;
  logical_combination_error_handler *plVar19;
  bool bVar20;
  logical_combination_error_handler esub;
  string __str;
  logical_combination_error_handler error_summary;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  undefined8 uStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ulong local_b8;
  logical_combination_error_handler **local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  logical_combination_error_handler *local_a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string *local_70;
  json_pointer *local_68;
  json *local_60;
  logical_combination<((anonymous_namespace)::logical_combination_types)2> *local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&PTR__logical_combination_error_handler_001577c8;
  local_50._M_string_length = 0;
  local_50.field_2._M_allocated_capacity = 0;
  local_50.field_2._8_8_ = 0;
  psVar8 = (this->subschemata_).
           super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (string *)e;
  local_68 = ptr;
  local_60 = instance;
  local_58 = this;
  if ((this->subschemata_).
      super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar8) {
    local_b8 = 0;
    uVar15 = 0;
    do {
      local_d8._M_dataplus._M_p = (pointer)&PTR__logical_combination_error_handler_001577c8;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity = 0;
      local_d8.field_2._8_8_ = 0;
      vVar3 = (patch->j_).m_type;
      __new_size = (size_t)vVar3;
      if (vVar3 != null) {
        if (vVar3 == object) {
          __new_size = (((patch->j_).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                       _M_node_count;
        }
        else if (vVar3 == array) {
          paVar4 = (patch->j_).m_value.array;
          __new_size = (long)(paVar4->
                             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(paVar4->
                             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4;
        }
        else {
          __new_size = 1;
        }
      }
      peVar5 = psVar8[uVar15].
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar5->_vptr_schema[3])(peVar5,local_68,local_60,patch,&local_d8);
      if (local_d8._M_string_length == local_d8.field_2._M_allocated_capacity) {
        if (local_b8 == 0) {
          local_b8 = 1;
          bVar20 = false;
        }
        else {
          local_90._M_dataplus._M_p = (pointer)0x56;
          local_f8 = &local_e8;
          ppaVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     **)std::__cxx11::string::_M_create((ulong *)&local_f8,(ulong)&local_90);
          _Var6._M_p = local_90._M_dataplus._M_p;
          local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_90._M_dataplus._M_p;
          local_f8 = ppaVar9;
          memcpy(ppaVar9,
                 "more than one subschema has succeeded, but exactly one of them is required to validate"
                 ,0x56);
          local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var6._M_p;
          *(char *)((long)ppaVar9 + (long)_Var6._M_p) = '\0';
          (**(_func_int **)((long)(local_70->_M_dataplus)._M_p + 0x10))
                    (local_70,local_68,local_60,&local_f8);
          if (local_f8 != &local_e8) {
            operator_delete(local_f8,(ulong)(local_e8->_M_local_buf + 1));
          }
          local_b8 = 2;
          bVar20 = true;
        }
      }
      else {
        this_00 = nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  get_ref_impl<std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (&patch->j_);
        std::
        vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::resize(this_00,__new_size);
        cVar17 = '\x01';
        if (9 < uVar15) {
          uVar12 = uVar15;
          cVar7 = '\x04';
          do {
            cVar17 = cVar7;
            if (uVar12 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_00123297;
            }
            if (uVar12 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_00123297;
            }
            if (uVar12 < 10000) goto LAB_00123297;
            bVar20 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar7 = cVar17 + '\x04';
          } while (bVar20);
          cVar17 = cVar17 + '\x01';
        }
LAB_00123297:
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct((ulong)&local_b0,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b0,local_a8,uVar15);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x14280d);
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_90.field_2._M_allocated_capacity = *psVar13;
          local_90.field_2._8_8_ = plVar10[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar13;
          local_90._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_90._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        ppaVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)*puVar11 == ppaVar9) {
          local_e8 = *ppaVar9;
          uStack_e0 = puVar11[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *ppaVar9;
          local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)*puVar11;
        }
        local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)puVar11[1];
        *puVar11 = ppaVar9;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        logical_combination_error_handler::propagate
                  ((logical_combination_error_handler *)local_d8._M_string_length,
                   (error_handler *)local_d8.field_2._M_allocated_capacity,&local_50);
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,(ulong)(local_e8->_M_local_buf + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0,(ulong)((long)&(local_a0[0]->super_error_handler).
                                                  _vptr_error_handler + 1));
        }
        bVar20 = 1 < local_b8;
      }
      uVar18 = local_d8.field_2._M_allocated_capacity;
      local_d8._M_dataplus._M_p = (pointer)&PTR__logical_combination_error_handler_001577c8;
      if (local_d8._M_string_length != local_d8.field_2._M_allocated_capacity) {
        ppeVar16 = &(((logical_combination_error_handler *)(local_d8._M_string_length + 0x20))->
                    error_entry_list_).
                    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        do {
          if ((pointer)ppeVar16 != ((_Vector_impl_data *)(ppeVar16 + -2))->_M_start) {
            operator_delete(((_Vector_impl_data *)(ppeVar16 + -2))->_M_start,
                            (ulong)((long)&((*ppeVar16)->ptr_).reference_tokens.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)(ppeVar16 + -4));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(ppeVar16 + -7));
          plVar10 = (long *)(ppeVar16 + 2);
          ppeVar16 = ppeVar16 + 9;
        } while (plVar10 != (long *)uVar18);
      }
      if ((logical_combination_error_handler *)local_d8._M_string_length !=
          (logical_combination_error_handler *)0x0) {
        operator_delete((void *)local_d8._M_string_length,
                        local_d8.field_2._8_8_ - local_d8._M_string_length);
      }
      if (bVar20) goto LAB_0012377b;
      uVar15 = uVar15 + 1;
      psVar8 = (local_58->subschemata_).
               super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(local_58->subschemata_).
                                    super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4))
    ;
    if (local_b8 != 0) goto LAB_0012377b;
  }
  std::operator+(&local_90,
                 "no subschema has succeeded, but one of them is required to validate. Type: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::
                  logical_combination<((anonymous_namespace)::logical_combination_types)2>::
                  key_abi_cxx11_);
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  paVar2 = &local_d8.field_2;
  puVar14 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_d8.field_2._M_allocated_capacity = *puVar14;
    local_d8.field_2._8_8_ = puVar11[3];
    local_d8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *puVar14;
    local_d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_d8._M_string_length = puVar11[1];
  *puVar11 = puVar14;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  uVar15 = (long)(local_58->subschemata_).
                 super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_58->subschemata_).
                 super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  cVar17 = '\x01';
  if (9 < uVar15) {
    uVar12 = uVar15;
    cVar7 = '\x04';
    do {
      cVar17 = cVar7;
      if (uVar12 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_00123570;
      }
      if (uVar12 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_00123570;
      }
      if (uVar12 < 10000) goto LAB_00123570;
      bVar20 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar7 = cVar17 + '\x04';
    } while (bVar20);
    cVar17 = cVar17 + '\x01';
  }
LAB_00123570:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b0,local_a8,uVar15);
  plVar1 = (logical_combination_error_handler *)
           ((long)&((error_handler *)local_d8._M_string_length)->_vptr_error_handler +
           CONCAT44(uStack_a4,local_a8));
  uVar18 = (logical_combination_error_handler *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    uVar18 = local_d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < plVar1) {
    plVar19 = (logical_combination_error_handler *)0xf;
    if (local_b0 != local_a0) {
      plVar19 = local_a0[0];
    }
    if (plVar19 < plVar1) goto LAB_001235d8;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_b0,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
  }
  else {
LAB_001235d8:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b0);
  }
  local_f8 = &local_e8;
  ppaVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)(puVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       **)*puVar11 == ppaVar9) {
    local_e8 = *ppaVar9;
    uStack_e0 = puVar11[3];
  }
  else {
    local_e8 = *ppaVar9;
    local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)*puVar11;
  }
  local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)puVar11[1];
  *puVar11 = ppaVar9;
  puVar11[1] = 0;
  *(undefined1 *)ppaVar9 = 0;
  (**(_func_int **)((long)(local_70->_M_dataplus)._M_p + 0x10))
            (local_70,local_68,local_60,&local_f8);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,(ulong)(local_e8->_M_local_buf + 1));
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,(ulong)((long)&(local_a0[0]->super_error_handler)._vptr_error_handler +
                                    1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_d8,"[combination: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::
                  logical_combination<((anonymous_namespace)::logical_combination_types)2>::
                  key_abi_cxx11_);
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
  ppaVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)(puVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       **)*puVar11 == ppaVar9) {
    local_e8 = *ppaVar9;
    uStack_e0 = puVar11[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *ppaVar9;
    local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)*puVar11;
  }
  local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)puVar11[1];
  *puVar11 = ppaVar9;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  logical_combination_error_handler::propagate
            ((logical_combination_error_handler *)local_50._M_string_length,
             (error_handler *)local_50.field_2._M_allocated_capacity,local_70);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,(ulong)(local_e8->_M_local_buf + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,(ulong)(local_d8.field_2._M_allocated_capacity + 1));
  }
LAB_0012377b:
  uVar18 = local_50.field_2._M_allocated_capacity;
  local_50._M_dataplus._M_p = (pointer)&PTR__logical_combination_error_handler_001577c8;
  if (local_50._M_string_length != local_50.field_2._M_allocated_capacity) {
    ppeVar16 = &(((logical_combination_error_handler *)(local_50._M_string_length + 0x20))->
                error_entry_list_).
                super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      if ((pointer)ppeVar16 != ((_Vector_impl_data *)(ppeVar16 + -2))->_M_start) {
        operator_delete(((_Vector_impl_data *)(ppeVar16 + -2))->_M_start,
                        (ulong)((long)&((*ppeVar16)->ptr_).reference_tokens.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)(ppeVar16 + -4));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(ppeVar16 + -7));
      plVar10 = (long *)(ppeVar16 + 2);
      ppeVar16 = ppeVar16 + 9;
    } while (plVar10 != (long *)uVar18);
  }
  if ((logical_combination_error_handler *)local_50._M_string_length !=
      (logical_combination_error_handler *)0x0) {
    operator_delete((void *)local_50._M_string_length,
                    local_50.field_2._8_8_ - local_50._M_string_length);
  }
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &patch, error_handler &e) const final
	{
		size_t count = 0;
		logical_combination_error_handler error_summary;

		for (std::size_t index = 0; index < subschemata_.size(); ++index) {
			const std::shared_ptr<schema> &s = subschemata_[index];
			logical_combination_error_handler esub;
			auto oldPatchSize = patch.get_json().size();
			s->validate(ptr, instance, patch, esub);
			if (!esub)
				count++;
			else {
				patch.get_json().get_ref<nlohmann::json::array_t &>().resize(oldPatchSize);
				esub.propagate(error_summary, "case#" + std::to_string(index) + "] ");
			}

			if (is_validate_complete(instance, ptr, e, esub, count, index))
				return;
		}

		if (count == 0) {
			e.error(ptr, instance, "no subschema has succeeded, but one of them is required to validate. Type: " + key + ", number of failed subschemas: " + std::to_string(subschemata_.size()));
			error_summary.propagate(e, "[combination: " + key + " / ");
		}
	}